

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O3

int accept_pathname(char *pathname)

{
  int iVar1;
  int iVar2;
  pattern *entry;
  pattern *ppVar3;
  
  ppVar3 = include.stqh_first;
  if (include.stqh_first == (pattern *)0x0) {
LAB_001050d4:
    iVar1 = 1;
    for (ppVar3 = exclude.stqh_first; ppVar3 != (pattern *)0x0; ppVar3 = (ppVar3->link).stqe_next) {
      iVar2 = fnmatch((char *)(ppVar3 + 1),pathname,(uint)C_opt << 4);
      if (iVar2 == 0) goto LAB_001050cb;
    }
  }
  else {
    do {
      iVar1 = fnmatch((char *)(ppVar3 + 1),pathname,(uint)C_opt << 4);
      if (iVar1 == 0) goto LAB_001050d4;
      ppVar3 = (ppVar3->link).stqe_next;
    } while (ppVar3 != (pattern *)0x0);
LAB_001050cb:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
accept_pathname(const char *pathname)
{

	if (!STAILQ_EMPTY(&include) && !match_pattern(&include, pathname))
		return (0);
	if (!STAILQ_EMPTY(&exclude) && match_pattern(&exclude, pathname))
		return (0);
	return (1);
}